

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<CURLcode_const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<CURLcode_const&> *this,CURLcode *rhs)

{
  CURLcode CVar1;
  CURLcode CVar2;
  lest *this_00;
  CURLcode *in_R8;
  allocator local_71;
  string local_70;
  string local_50 [32];
  
  this_00 = *(lest **)this;
  CVar1 = *(CURLcode *)this_00;
  CVar2 = *rhs;
  std::__cxx11::string::string(local_50,"!=",&local_71);
  to_string<CURLcode,CURLcode>(&local_70,this_00,(CURLcode *)local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = CVar1 != CVar2;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_70)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result{ lhs == rhs, to_string( lhs, "==", rhs ) }; }